

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::NewAppendableFile
          (InMemoryEnv *this,string *fname,WritableFile **result)

{
  mapped_type *ppFVar1;
  WritableFileImpl *this_00;
  Mutex *in_RCX;
  FileState *local_40;
  FileState *file;
  FileState **sptr;
  MutexLock lock;
  WritableFile **result_local;
  string *fname_local;
  InMemoryEnv *this_local;
  
  lock.mu_ = in_RCX;
  MutexLock::MutexLock((MutexLock *)&sptr,(Mutex *)&fname->field_2);
  ppFVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
                          *)((long)&fname[1].field_2 + 8),(key_type *)result);
  local_40 = *ppFVar1;
  if (local_40 == (mapped_type)0x0) {
    local_40 = (FileState *)operator_new(0x78);
    FileState::FileState(local_40);
    FileState::Ref(local_40);
  }
  this_00 = (WritableFileImpl *)operator_new(0x10);
  WritableFileImpl::WritableFileImpl(this_00,local_40);
  *(WritableFileImpl **)&((lock.mu_)->mu_).super___mutex_base._M_mutex = this_00;
  Status::OK();
  MutexLock::~MutexLock((MutexLock *)&sptr);
  return (Status)(char *)this;
}

Assistant:

Status NewAppendableFile(const std::string& fname,
                           WritableFile** result) override {
    MutexLock lock(&mutex_);
    FileState** sptr = &file_map_[fname];
    FileState* file = *sptr;
    if (file == nullptr) {
      file = new FileState();
      file->Ref();
    }
    *result = new WritableFileImpl(file);
    return Status::OK();
  }